

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaDeviceMemoryBlock::Unmap(VmaDeviceMemoryBlock *this,VmaAllocator hAllocator,uint32_t count)

{
  uint32_t uVar1;
  VmaMutexLock lock;
  VmaMutexLock local_20;
  
  if (count != 0) {
    local_20.m_pMutex = (VmaMutex *)0x0;
    if (hAllocator->m_UseMutex != false) {
      local_20.m_pMutex = &this->m_MapAndBindMutex;
    }
    if (hAllocator->m_UseMutex == true) {
      std::mutex::lock(&(this->m_MapAndBindMutex).m_Mutex);
    }
    uVar1 = this->m_MapCount - count;
    if (count <= this->m_MapCount) {
      this->m_MapCount = uVar1;
      if (uVar1 + (this->m_MappingHysteresis).m_ExtraMapping == 0) {
        this->m_pMappedData = (void *)0x0;
        (*(hAllocator->m_VulkanFunctions).vkUnmapMemory)(hAllocator->m_hDevice,this->m_hMemory);
      }
      VmaMappingHysteresis::PostUnmap(&this->m_MappingHysteresis);
    }
    VmaMutexLock::~VmaMutexLock(&local_20);
  }
  return;
}

Assistant:

void VmaDeviceMemoryBlock::Unmap(VmaAllocator hAllocator, uint32_t count)
{
    if (count == 0)
    {
        return;
    }

    VmaMutexLock lock(m_MapAndBindMutex, hAllocator->m_UseMutex);
    if (m_MapCount >= count)
    {
        m_MapCount -= count;
        const uint32_t totalMapCount = m_MapCount + m_MappingHysteresis.GetExtraMapping();
        if (totalMapCount == 0)
        {
            m_pMappedData = VMA_NULL;
            (*hAllocator->GetVulkanFunctions().vkUnmapMemory)(hAllocator->m_hDevice, m_hMemory);
        }
        m_MappingHysteresis.PostUnmap();
    }
    else
    {
        VMA_ASSERT(0 && "VkDeviceMemory block is being unmapped while it was not previously mapped.");
    }
}